

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void identPut(char *z,int *pIdx,char *zSignedIdent)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint n;
  long lVar6;
  ulong uVar7;
  byte *pbVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  int id;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = *pIdx;
  uVar7 = (ulong)(byte)*zSignedIdent;
  if (uVar7 != 0) {
    lVar6 = 0;
    uVar5 = uVar7;
    do {
      bVar9 = (""[uVar5] & 6) == 0;
      bVar10 = (char)uVar5 != '_';
      bVar2 = bVar10 && bVar9;
      if (bVar2) break;
      lVar3 = lVar6 + 1;
      uVar5 = (ulong)(byte)zSignedIdent[lVar3];
      lVar6 = lVar6 + 1;
    } while (zSignedIdent[lVar3] != 0);
    if (uVar7 - 0x3a < 0xfffffffffffffff6) {
      local_3c = 0x3c;
      n = (uint)lVar6;
      if (n < 2) {
        if (n != 0 && (!bVar10 || !bVar9)) goto LAB_00186e6d;
      }
      else {
        keywordCode(zSignedIdent,n,&local_3c);
        if ((bool)(~bVar2 & local_3c == 0x3c)) {
LAB_00186e6d:
          bVar2 = false;
          goto LAB_00186e8b;
        }
      }
    }
  }
  lVar6 = (long)iVar4;
  iVar4 = iVar4 + 1;
  z[lVar6] = '\"';
  uVar7 = (ulong)(byte)*zSignedIdent;
  bVar2 = true;
LAB_00186e8b:
  if ((char)uVar7 != '\0') {
    pbVar8 = (byte *)(zSignedIdent + 1);
    do {
      z[iVar4] = (char)uVar7;
      uVar5 = (long)iVar4 + 1;
      if (pbVar8[-1] == 0x22) {
        z[uVar5] = '\"';
        uVar5 = (ulong)(iVar4 + 2);
      }
      bVar1 = *pbVar8;
      uVar7 = (ulong)bVar1;
      pbVar8 = pbVar8 + 1;
      iVar4 = (int)uVar5;
    } while (bVar1 != 0);
  }
  if (bVar2) {
    lVar6 = (long)iVar4;
    iVar4 = iVar4 + 1;
    z[lVar6] = '\"';
  }
  z[iVar4] = '\0';
  *pIdx = iVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void identPut(char *z, int *pIdx, char *zSignedIdent){
  unsigned char *zIdent = (unsigned char*)zSignedIdent;
  int i, j, needQuote;
  i = *pIdx;

  for(j=0; zIdent[j]; j++){
    if( !sqlite3Isalnum(zIdent[j]) && zIdent[j]!='_' ) break;
  }
  needQuote = sqlite3Isdigit(zIdent[0])
            || sqlite3KeywordCode(zIdent, j)!=TK_ID
            || zIdent[j]!=0
            || j==0;

  if( needQuote ) z[i++] = '"';
  for(j=0; zIdent[j]; j++){
    z[i++] = zIdent[j];
    if( zIdent[j]=='"' ) z[i++] = '"';
  }
  if( needQuote ) z[i++] = '"';
  z[i] = 0;
  *pIdx = i;
}